

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

CPAccessResult gt_cntfrq_access(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,_Bool isread)

{
  ulong uVar1;
  uint64_t uVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  
  uVar1 = env->features;
  if (((uint)uVar1 >> 9 & 1) == 0) {
    if (env->aarch64 == 0) {
      uVar4 = env->uncached_cpsr & 0x1f;
      if (uVar4 == 0x10) {
        uVar4 = 0;
      }
      else if (uVar4 == 0x16) {
        uVar4 = 3;
      }
      else if (uVar4 == 0x1a) {
        uVar4 = 2;
      }
      else {
        if ((uVar1 >> 0x21 & 1) != 0) {
          bVar5 = uVar4 == 0x16;
          if (!bVar5) {
            bVar5 = ((env->cp15).scr_el3 & 1) == 0;
          }
          if ((((uint)uVar1 >> 0x1c & 1) == 0) && (uVar4 = 3, bVar5)) goto LAB_00621bd4;
        }
        uVar4 = 1;
      }
    }
    else {
      uVar4 = env->pstate >> 2 & 3;
    }
  }
  else {
    uVar4 = 1;
    if ((env->v7m).exception == 0) {
      uVar4 = ~(env->v7m).control[(env->v7m).secure] & 1;
    }
  }
LAB_00621bd4:
  if (uVar4 == 1) {
    if (isread) {
      return CP_ACCESS_OK;
    }
    if ((((uVar1 >> 0x21 & 1) != 0) && (ri->state == 0)) && (((env->cp15).scr_el3 & 1) == 0)) {
      return CP_ACCESS_TRAP_UNCATEGORIZED;
    }
  }
  else if (uVar4 == 0) {
    uVar2 = arm_hcr_el2_eff_aarch64(env);
    if ((~uVar2 & 0x408000000) == 0) {
      uVar3 = (env->cp15).cnthctl_el2;
    }
    else {
      uVar3 = (uint)(env->cp15).c14_cntkctl;
    }
    if ((uVar3 & 3) == 0) {
      return CP_ACCESS_TRAP;
    }
  }
  if (!isread) {
    uVar3 = 3;
    if ((uVar1 >> 0x21 & 1) == 0) {
      uVar3 = ((uVar1 >> 0x20 & 1) != 0) + 1;
    }
    if (uVar4 < uVar3) {
      return CP_ACCESS_TRAP_UNCATEGORIZED;
    }
  }
  return CP_ACCESS_OK;
}

Assistant:

static CPAccessResult gt_cntfrq_access(CPUARMState *env, const ARMCPRegInfo *ri,
                                       bool isread)
{
    /* CNTFRQ: not visible from PL0 if both PL0PCTEN and PL0VCTEN are zero.
     * Writable only at the highest implemented exception level.
     */
    int el = arm_current_el(env);
    uint64_t hcr;
    uint32_t cntkctl;

    switch (el) {
    case 0:
        hcr = arm_hcr_el2_eff(env);
        if ((hcr & (HCR_E2H | HCR_TGE)) == (HCR_E2H | HCR_TGE)) {
            cntkctl = env->cp15.cnthctl_el2;
        } else {
            cntkctl = env->cp15.c14_cntkctl;
        }
        if (!extract32(cntkctl, 0, 2)) {
            return CP_ACCESS_TRAP;
        }
        break;
    case 1:
        if (!isread && ri->state == ARM_CP_STATE_AA32 &&
            arm_is_secure_below_el3(env)) {
            /* Accesses from 32-bit Secure EL1 UNDEF (*not* trap to EL3!) */
            return CP_ACCESS_TRAP_UNCATEGORIZED;
        }
        break;
    case 2:
    case 3:
        break;
    }

    if (!isread && el < arm_highest_el(env)) {
        return CP_ACCESS_TRAP_UNCATEGORIZED;
    }

    return CP_ACCESS_OK;
}